

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-utils.c
# Opt level: O1

long coda_c_index_to_fortran_index(int num_dims,long *dim,long index)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long d [8];
  long alStack_50 [10];
  
  if (num_dims < 9) {
    lVar2 = (long)num_dims;
    if (0 < num_dims) {
      do {
        lVar3 = dim[lVar2 + -1];
        alStack_50[lVar2] = index % lVar3;
        lVar4 = lVar2 + -1;
        bVar1 = 0 < lVar2;
        index = index / lVar3;
        lVar2 = lVar4;
      } while (lVar4 != 0 && bVar1);
    }
    if (num_dims < 1) {
      lVar2 = 0;
    }
    else {
      lVar3 = 1;
      lVar2 = 0;
      lVar4 = 0;
      do {
        lVar2 = lVar2 + alStack_50[lVar4 + 1] * lVar3;
        lVar3 = lVar3 * dim[lVar4];
        lVar4 = lVar4 + 1;
      } while (num_dims != lVar4);
    }
  }
  else {
    alStack_50[0] = 0x137eee;
    coda_set_error(-100,"num_dims argument (%d) exceeds limit (%d)",num_dims,8);
    lVar2 = -1;
  }
  return lVar2;
}

Assistant:

LIBCODA_API long coda_c_index_to_fortran_index(int num_dims, const long dim[], long index)
{
    long i, indexf, multiplier, d[CODA_MAX_NUM_DIMS];

    if (num_dims > CODA_MAX_NUM_DIMS)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "num_dims argument (%d) exceeds limit (%d)", num_dims,
                       CODA_MAX_NUM_DIMS);
        return -1;
    }

    for (i = num_dims - 1; i >= 0; i--)
    {
        d[i] = index % dim[i];
        index /= dim[i];
    }

    indexf = 0;
    multiplier = 1;

    for (i = 0; i < num_dims; i++)
    {
        indexf += multiplier * d[i];
        multiplier *= dim[i];
    }

    return indexf;
}